

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

uint mwGrab_(uint kb,int type,int silent)

{
  char *pcVar1;
  mwGrabData *pmVar2;
  mwGrabData *gd;
  uint i;
  int silent_local;
  int type_local;
  uint kb_local;
  
  silent_local = kb;
  if (kb == 0) {
    silent_local = 65000;
    kb = silent_local;
  }
  while( true ) {
    if (silent_local == 0) {
      if (silent == 0) {
        pcVar1 = mwGrabType(type);
        mwWrite("grabbed: %u kilobytes of %s memory\n",(ulong)kb,pcVar1);
        mwFlush();
      }
      return kb;
    }
    if ((mwUseLimit != 0) && (mwAllocLimit < mwStatCurAlloc + mwGrabSize + 0x400)) break;
    pmVar2 = (mwGrabData *)malloc(0x400);
    if (pmVar2 == (mwGrabData *)0x0) {
      if (silent == 0) {
        pcVar1 = mwGrabType(type);
        mwWrite("grabbed: all available memory to %s (%u kb)\n",pcVar1,(ulong)(kb - silent_local));
        mwFlush();
      }
      return kb - silent_local;
    }
    mwGrabSize = mwGrabSize + 0x400;
    pmVar2->next = mwGrabList;
    memset(pmVar2->blob,type & 0xff,0x3f4);
    pmVar2->type = type;
    silent_local = silent_local + -1;
    mwGrabList = pmVar2;
  }
  if (silent == 0) {
    pcVar1 = mwGrabType(type);
    mwWrite("grabbed: all allowed memory to %s (%u kb)\n",pcVar1,(ulong)(kb - silent_local));
    mwFlush();
  }
  return kb - silent_local;
}

Assistant:

static unsigned mwGrab_(unsigned kb, int type, int silent)
{
	unsigned i = kb;
	mwGrabData *gd;
	if (!kb) {
		i = kb = 65000U;
	}

	for (; kb; kb--) {
		if (mwUseLimit &&
			(mwStatCurAlloc + mwGrabSize + (long)sizeof(mwGrabData) > mwAllocLimit)) {
			if (!silent) {
				mwWrite("grabbed: all allowed memory to %s (%u kb)\n",
						mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		gd = (mwGrabData *) malloc(sizeof(mwGrabData));
		if (gd == NULL) {
			if (!silent) {
				mwWrite("grabbed: all available memory to %s (%u kb)\n",
						mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		mwGrabSize += (long) sizeof(mwGrabData);
		gd->next = mwGrabList;
		memset(gd->blob, type, sizeof(gd->blob));
		gd->type = type;
		mwGrabList = gd;
	}
	if (!silent) {
		mwWrite("grabbed: %u kilobytes of %s memory\n", i, mwGrabType(type));
		FLUSH();
	}
	return i;
}